

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool __thiscall JetHead::Path::normalize(Path *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  
  local_48.mAllocated = 0x20;
  local_48.mData =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(0x400);
  local_48.mSize = 0;
  local_60.mAllocated = 0x20;
  local_60.mData =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(0x400);
  local_60.mSize = 0;
  split<std::__cxx11::string>(&this->mPath,"/",&local_48);
  if (local_48.mSize != 0) {
    bVar2 = true;
    lVar4 = 0;
    uVar5 = 0;
    do {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((long)&((local_48.mData)->_M_dataplus)._M_p + lVar4));
      if (iVar3 == 0) {
        if (bVar2) {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          push_back(&local_60,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&((local_48.mData)->_M_dataplus)._M_p + lVar4));
        }
        else {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          erase(&local_60,local_60.mSize - 1);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((long)&((local_48.mData)->_M_dataplus)._M_p + lVar4));
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((long)&((local_48.mData)->_M_dataplus)._M_p + lVar4));
          if (iVar3 != 0) {
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::push_back(&local_60,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&((local_48.mData)->_M_dataplus)._M_p + lVar4));
            bVar2 = false;
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < local_48.mSize);
  }
  pcVar1 = (this->mPath)._M_dataplus._M_p;
  if (*pcVar1 == '/') {
    std::__cxx11::string::_M_replace_aux((ulong)this,0,(this->mPath)._M_string_length,'\x01');
  }
  else {
    (this->mPath)._M_string_length = 0;
    *pcVar1 = '\0';
  }
  uVar5 = (ulong)(local_60.mSize - 1);
  if (local_60.mSize - 1 != 0) {
    lVar4 = 8;
    uVar6 = 0;
    do {
      std::__cxx11::string::_M_append((char *)this,*(ulong *)((long)local_60.mData + lVar4 + -8));
      std::__cxx11::string::_M_replace_aux((ulong)this,(this->mPath)._M_string_length,0,'\x01');
      uVar6 = uVar6 + 1;
      uVar5 = (ulong)(local_60.mSize - 1);
      lVar4 = lVar4 + 0x20;
    } while (uVar6 < uVar5);
  }
  std::__cxx11::string::_M_append((char *)this,(ulong)local_60.mData[uVar5]._M_dataplus._M_p);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            (&local_60);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            (&local_48);
  return true;
}

Assistant:

bool	Path::normalize()
{
	JetHead::vector<JHSTD::string> parts;
	JetHead::vector<JHSTD::string> parts2;
	JetHead::split( mPath, "/", parts );
	bool start = true;
	
	for ( unsigned i = 0; i < parts.size(); i++ )
	{
		if ( parts[ i ] == ".." )
		{
			if ( !start )
				parts2.erase( parts2.size() - 1	);
			else
				parts2.push_back( parts[ i ] );
		}
		else if ( parts[ i ] != "." && parts[ i ] != "" )
		{
			start = false;
			parts2.push_back( parts[ i ] );
		}
	}
		
	if ( isRelative() == false )
		mPath.assign( 1, PATH_SEPERATOR );
	else
		mPath.clear();
	
	for ( unsigned i = 0; i < parts2.size() - 1; i++ )
	{
		mPath.append( parts2[ i ] );
		mPath.append( 1, PATH_SEPERATOR );
	}

	mPath.append( parts2[ parts2.size() - 1 ] );
	
	return true;
}